

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

bool __thiscall
spvtools::Optimizer::RegisterPassesFromFlags
          (Optimizer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *flags,bool preserve_interface)

{
  string *psVar1;
  bool bVar2;
  string *flag;
  bool bVar3;
  
  flag = (flags->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (flags->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = flag == psVar1;
  if ((!bVar3) && (bVar2 = RegisterPassFromFlag(this,flag,preserve_interface), bVar2)) {
    do {
      flag = flag + 1;
      bVar3 = flag == psVar1;
      if (bVar3) {
        return bVar3;
      }
      bVar2 = RegisterPassFromFlag(this,flag,preserve_interface);
    } while (bVar2);
  }
  return bVar3;
}

Assistant:

Optimizer::PassToken CreateCombineAccessChainsPass() {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::CombineAccessChains>());
}